

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::GenTypeNative_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,Type *type,bool invector,
          FieldDef *field,bool forcopy)

{
  StructDef *pSVar1;
  EnumDef *def;
  bool bVar2;
  Value *pVVar3;
  allocator<char> local_281;
  string local_280;
  undefined1 local_260 [8];
  string type_name_2;
  string nn;
  string local_218;
  Value *local_1f8;
  Value *native_type;
  string local_1e8;
  undefined1 local_1c8 [8];
  string type_name_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_d9;
  string local_d8;
  Value *local_b8;
  Value *native_custom_alloc;
  byte local_9a;
  allocator<char> local_99;
  string local_98;
  Type local_78;
  undefined1 local_58 [8];
  string type_name;
  bool forcopy_local;
  FieldDef *field_local;
  bool invector_local;
  Type *type_local;
  CppGenerator *this_local;
  
  type_name.field_2._M_local_buf[0xf] = forcopy;
  switch(type->base_type) {
  case BASE_TYPE_STRING:
    NativeString_abi_cxx11_(__return_storage_ptr__,this,field);
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_VECTOR64:
    Type::VectorType(&local_78,type);
    GenTypeNative_abi_cxx11_((string *)local_58,this,&local_78,true,field,false);
    local_9a = 0;
    native_custom_alloc._3_1_ = 0;
    bVar2 = false;
    if (type->struct_def != (StructDef *)0x0) {
      pSVar1 = type->struct_def;
      std::allocator<char>::allocator();
      local_9a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"native_custom_alloc",&local_99);
      native_custom_alloc._3_1_ = 1;
      pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                         (&(pSVar1->super_Definition).attributes,&local_98);
      bVar2 = pVVar3 != (Value *)0x0;
    }
    if ((native_custom_alloc._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_98);
    }
    if ((local_9a & 1) != 0) {
      std::allocator<char>::~allocator(&local_99);
    }
    if (bVar2) {
      pSVar1 = type->struct_def;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"native_custom_alloc",&local_d9);
      pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                         (&(pSVar1->super_Definition).attributes,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      local_b8 = pVVar3;
      std::operator+(&local_180,"std::vector<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::operator+(&local_160,&local_180,",");
      std::operator+(&local_140,&local_160,&local_b8->constant);
      std::operator+(&local_120,&local_140,"<");
      std::operator+(&local_100,&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::operator+(__return_storage_ptr__,&local_100,">>");
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&type_name_1.field_2 + 8),"std::vector<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&type_name_1.field_2 + 8),">");
      std::__cxx11::string::~string((string *)(type_name_1.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)local_58);
    break;
  case BASE_TYPE_STRUCT:
    pSVar1 = type->struct_def;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"",(allocator<char> *)((long)&native_type + 7));
    BaseGenerator::WrapInNameSpace
              ((string *)local_1c8,&this->super_BaseGenerator,&pSVar1->super_Definition,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&native_type + 7));
    bVar2 = IsStruct(type);
    if (bVar2) {
      pSVar1 = type->struct_def;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"native_type",
                 (allocator<char> *)(nn.field_2._M_local_buf + 0xf));
      pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                         (&(pSVar1->super_Definition).attributes,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator((allocator<char> *)(nn.field_2._M_local_buf + 0xf));
      local_1f8 = pVVar3;
      if (pVVar3 != (Value *)0x0) {
        std::__cxx11::string::operator=((string *)local_1c8,(string *)&pVVar3->constant);
      }
      if (((invector) || ((field->native_inline & 1U) != 0)) ||
         ((type_name.field_2._M_local_buf[0xf] & 1U) != 0)) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_1c8);
      }
      else {
        GenTypeNativePtr(__return_storage_ptr__,this,(string *)local_1c8,field,false);
      }
    }
    else {
      WrapNativeNameInNameSpace_abi_cxx11_
                ((string *)((long)&type_name_2.field_2 + 8),this,type->struct_def,
                 &(this->opts_).super_IDLOptions);
      if (((type_name.field_2._M_local_buf[0xf] & 1U) == 0) && ((field->native_inline & 1U) == 0)) {
        GenTypeNativePtr(__return_storage_ptr__,this,(string *)((long)&type_name_2.field_2 + 8),
                         field,false);
      }
      else {
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,(string *)(type_name_2.field_2._M_local_buf + 8)
                  );
      }
      std::__cxx11::string::~string((string *)(type_name_2.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)local_1c8);
    break;
  case BASE_TYPE_UNION:
    def = type->enum_def;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"",&local_281);
    BaseGenerator::WrapInNameSpace
              ((string *)local_260,&this->super_BaseGenerator,&def->super_Definition,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                   "Union");
    std::__cxx11::string::~string((string *)local_260);
    break;
  default:
    bVar2 = FieldDef::IsScalarOptional(field);
    if (bVar2) {
      GenOptionalDecl_abi_cxx11_(__return_storage_ptr__,this,type);
    }
    else {
      GenTypeBasic_abi_cxx11_(__return_storage_ptr__,this,type,true);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeNative(const Type &type, bool invector,
                            const FieldDef &field, bool forcopy = false) {
    switch (type.base_type) {
      case BASE_TYPE_STRING: {
        return NativeString(&field);
      }
      case BASE_TYPE_VECTOR64:
      case BASE_TYPE_VECTOR: {
        const auto type_name = GenTypeNative(type.VectorType(), true, field);
        if (type.struct_def &&
            type.struct_def->attributes.Lookup("native_custom_alloc")) {
          auto native_custom_alloc =
              type.struct_def->attributes.Lookup("native_custom_alloc");
          return "std::vector<" + type_name + "," +
                 native_custom_alloc->constant + "<" + type_name + ">>";
        } else {
          return "std::vector<" + type_name + ">";
        }
      }
      case BASE_TYPE_STRUCT: {
        auto type_name = WrapInNameSpace(*type.struct_def);
        if (IsStruct(type)) {
          auto native_type = type.struct_def->attributes.Lookup("native_type");
          if (native_type) { type_name = native_type->constant; }
          if (invector || field.native_inline || forcopy) {
            return type_name;
          } else {
            return GenTypeNativePtr(type_name, &field, false);
          }
        } else {
          const auto nn = WrapNativeNameInNameSpace(*type.struct_def, opts_);
          return (forcopy || field.native_inline)
                     ? nn
                     : GenTypeNativePtr(nn, &field, false);
        }
      }
      case BASE_TYPE_UNION: {
        auto type_name = WrapInNameSpace(*type.enum_def);
        return type_name + "Union";
      }
      default: {
        return field.IsScalarOptional() ? GenOptionalDecl(type)
                                        : GenTypeBasic(type, true);
      }
    }
  }